

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O1

void set_derives(void)

{
  char *pcVar1;
  Yshort *pYVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  derives = (Yshort **)allocate(nsyms << 3);
  pcVar3 = allocate((nrules + nvars) * 4);
  lVar4 = (long)start_symbol;
  if (start_symbol < nsyms) {
    iVar5 = 0;
    do {
      derives[lVar4] = (Yshort *)(pcVar3 + (long)iVar5 * 4);
      pYVar2 = rlhs;
      if (0 < nrules) {
        lVar6 = 0;
        do {
          if (pYVar2[lVar6] == (int)lVar4) {
            *(int *)(pcVar3 + (long)iVar5 * 4) = (int)lVar6;
            iVar5 = iVar5 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < nrules);
      }
      pcVar1 = pcVar3 + (long)iVar5 * 4;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      iVar5 = iVar5 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < nsyms);
  }
  return;
}

Assistant:

void set_derives()
{
    register int i, k;
    register int lhs;
    register Yshort *rules;

    derives = NEW2(nsyms, Yshort *);
    rules = NEW2(nvars + nrules, Yshort);

    k = 0;
    for (lhs = start_symbol; lhs < nsyms; lhs++)
    {
	derives[lhs] = rules + k;
	for (i = 0; i < nrules; i++)
	{
	    if (rlhs[i] == lhs)
	    {
		rules[k] = i;
		k++;
	    }
	}
	rules[k] = -1;
	k++;
    }

#ifdef	DEBUG
    print_derives();
#endif
}